

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

bool __thiscall SQLite::Database::tableExists(Database *this,char *apTableName)

{
  int32_t iVar1;
  socklen_t in_ECX;
  long in_FS_OFFSET;
  Column local_b8;
  sockaddr *local_90;
  char *apTableName_local;
  Database *this_local;
  Statement query;
  
  query.mColumnNames._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)(in_FS_OFFSET + 0x28);
  local_90 = (sockaddr *)apTableName;
  apTableName_local = (char *)this;
  Statement::Statement
            ((Statement *)&this_local,this,
             "SELECT count(*) FROM sqlite_master WHERE type=\'table\' AND name=?");
  Statement::bind((Statement *)&this_local,1,local_90,in_ECX);
  Statement::executeStep((Statement *)&this_local);
  Statement::getColumn(&local_b8,(Statement *)&this_local,0);
  iVar1 = Column::getInt(&local_b8);
  Column::~Column(&local_b8);
  Statement::~Statement((Statement *)&this_local);
  if (*(size_t *)(in_FS_OFFSET + 0x28) ==
      query.mColumnNames._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    return iVar1 == 1;
  }
  __stack_chk_fail();
}

Assistant:

bool Database::tableExists(const char* apTableName) const
{
    Statement query(*this, "SELECT count(*) FROM sqlite_master WHERE type='table' AND name=?");
    query.bind(1, apTableName);
    (void)query.executeStep(); // Cannot return false, as the above query always return a result
    return (1 == query.getColumn(0).getInt());
}